

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMA.hpp
# Opt level: O0

uint8_t __thiscall PCCompatible::i8237::status(i8237 *this)

{
  bool bVar1;
  reference pvVar2;
  iterator pvVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  value_type *channel;
  iterator __end2;
  iterator __begin2;
  array<PCCompatible::i8237::Channel,_4UL> *__range2;
  uint8_t result;
  i8237 *this_local;
  
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,0);
  bVar1 = pvVar2->transfer_complete;
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,1);
  bVar4 = 0;
  if ((pvVar2->transfer_complete & 1U) != 0) {
    bVar4 = 2;
  }
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,2);
  bVar5 = 0;
  if ((pvVar2->transfer_complete & 1U) != 0) {
    bVar5 = 4;
  }
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,3);
  bVar6 = 0;
  if ((pvVar2->transfer_complete & 1U) != 0) {
    bVar6 = 8;
  }
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,0);
  bVar7 = 0;
  if ((pvVar2->request & 1U) != 0) {
    bVar7 = 0x10;
  }
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,1);
  bVar8 = 0;
  if ((pvVar2->request & 1U) != 0) {
    bVar8 = 0x20;
  }
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,2);
  bVar9 = 0;
  if ((pvVar2->request & 1U) != 0) {
    bVar9 = 0x40;
  }
  pvVar2 = std::array<PCCompatible::i8237::Channel,_4UL>::operator[](&this->channels_,3);
  bVar10 = 0;
  if ((pvVar2->request & 1U) != 0) {
    bVar10 = 0x80;
  }
  __end2 = std::array<PCCompatible::i8237::Channel,_4UL>::begin(&this->channels_);
  pvVar3 = std::array<PCCompatible::i8237::Channel,_4UL>::end(&this->channels_);
  for (; __end2 != pvVar3; __end2 = __end2 + 1) {
    __end2->transfer_complete = false;
  }
  return (bVar1 & 1U) != 0 | bVar4 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9 | bVar10;
}

Assistant:

uint8_t status() {
			const uint8_t result =
				(channels_[0].transfer_complete ? 0x01 : 0x00) |
				(channels_[1].transfer_complete ? 0x02 : 0x00) |
				(channels_[2].transfer_complete ? 0x04 : 0x00) |
				(channels_[3].transfer_complete ? 0x08 : 0x00) |

				(channels_[0].request ? 0x10 : 0x00) |
				(channels_[1].request ? 0x20 : 0x00) |
				(channels_[2].request ? 0x40 : 0x00) |
				(channels_[3].request ? 0x80 : 0x00);

			for(auto &channel : channels_) {
				channel.transfer_complete = false;
			}

//			printf("DMA: status is %02x\n", result);

			return result;
		}